

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

short EpollEvent2Poll(uint32_t events)

{
  ushort local_e;
  short e;
  uint32_t events_local;
  
  local_e = (ushort)((events & 1) != 0);
  if ((events & 4) != 0) {
    local_e = local_e | 4;
  }
  if ((events & 0x10) != 0) {
    local_e = local_e | 0x10;
  }
  if ((events & 8) != 0) {
    local_e = local_e | 8;
  }
  if ((events & 0x40) != 0) {
    local_e = local_e | 0x40;
  }
  if ((events & 0x100) != 0) {
    local_e = local_e | 0x100;
  }
  return local_e;
}

Assistant:

static short EpollEvent2Poll( uint32_t events )
{
	short e = 0;	
	if( events & EPOLLIN ) 	e |= POLLIN;
	if( events & EPOLLOUT ) e |= POLLOUT;
	if( events & EPOLLHUP ) e |= POLLHUP;
	if( events & EPOLLERR ) e |= POLLERR;
	if( events & EPOLLRDNORM ) e |= POLLRDNORM;
	if( events & EPOLLWRNORM ) e |= POLLWRNORM;
	return e;
}